

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O3

double __thiscall wasm::Random::getDouble(Random *this)

{
  anon_union_16_6_1532cd5a_for_Literal_0 local_28;
  undefined8 local_18;
  double local_10;
  
  local_28.i64 = get64(this);
  local_18 = 3;
  local_10 = (double)local_28.i64;
  wasm::Literal::~Literal((Literal *)&local_28.func);
  return local_10;
}

Assistant:

double Random::getDouble() { return Literal(get64()).reinterpretf64(); }